

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O3

_Bool ra_overwrite(roaring_array_t *source,roaring_array_t *dest,_Bool copy_on_write)

{
  _Bool _Var1;
  container_t *pcVar2;
  long lVar3;
  int32_t new_capacity;
  void **__ptr;
  long lVar4;
  
  ra_clear_containers(dest);
  new_capacity = source->size;
  if (new_capacity == 0) {
    dest->size = 0;
  }
  else {
    if (dest->allocation_size < new_capacity) {
      _Var1 = realloc_array(dest,new_capacity);
      if (!_Var1) {
        return false;
      }
      new_capacity = source->size;
    }
    dest->size = new_capacity;
    memcpy(dest->keys,source->keys,(long)new_capacity * 2);
    if (!copy_on_write) {
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
      if (dest->size < 1) {
        return true;
      }
      lVar3 = 0;
      do {
        pcVar2 = container_clone(source->containers[lVar3],source->typecodes[lVar3]);
        dest->containers[lVar3] = pcVar2;
        __ptr = dest->containers;
        if (__ptr[lVar3] == (void *)0x0) {
          if (lVar3 != 0) {
            lVar4 = 0;
            do {
              container_free(dest->containers[lVar4],dest->typecodes[lVar4]);
              lVar4 = lVar4 + 1;
            } while (lVar3 != lVar4);
            __ptr = dest->containers;
          }
          roaring_free(__ptr);
          dest->keys = (uint16_t *)0x0;
          dest->typecodes = (uint8_t *)0x0;
          dest->size = 0;
          dest->allocation_size = 0;
          dest->containers = (void **)0x0;
          return false;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < dest->size);
      return true;
    }
    lVar3 = (long)dest->size;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        pcVar2 = get_copy_of_container(source->containers[lVar4],source->typecodes + lVar4,true);
        source->containers[lVar4] = pcVar2;
        lVar4 = lVar4 + 1;
        lVar3 = (long)dest->size;
      } while (lVar4 < lVar3);
    }
    memcpy(dest->containers,source->containers,lVar3 << 3);
    memcpy(dest->typecodes,source->typecodes,(long)dest->size);
  }
  return true;
}

Assistant:

bool ra_overwrite(const roaring_array_t *source, roaring_array_t *dest,
                  bool copy_on_write) {
    ra_clear_containers(dest);  // we are going to overwrite them
    if (source->size == 0) {    // Note: can't call memcpy(NULL), even w/size
        dest->size = 0;         // <--- This is important.
        return true;            // output was just cleared, so they match
    }
    if (dest->allocation_size < source->size) {
        if (!realloc_array(dest, source->size)) {
            return false;
        }
    }
    dest->size = source->size;
    memcpy(dest->keys, source->keys, dest->size * sizeof(uint16_t));
    // we go through the containers, turning them into shared containers...
    if (copy_on_write) {
        for (int32_t i = 0; i < dest->size; ++i) {
            source->containers[i] = get_copy_of_container(
                source->containers[i], &source->typecodes[i], copy_on_write);
        }
        // we do a shallow copy to the other bitmap
        memcpy(dest->containers, source->containers,
               dest->size * sizeof(container_t *));
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
    } else {
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
        for (int32_t i = 0; i < dest->size; i++) {
            dest->containers[i] =
                container_clone(source->containers[i], source->typecodes[i]);
            if (dest->containers[i] == NULL) {
                for (int32_t j = 0; j < i; j++) {
                    container_free(dest->containers[j], dest->typecodes[j]);
                }
                ra_clear_without_containers(dest);
                return false;
            }
        }
    }
    return true;
}